

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningCalculator.cpp
# Opt level: O3

void __thiscall
KDIS::UTILS::DeadReckoningCalculator::computeDRMatrix
          (DeadReckoningCalculator *this,TMATRIX *res,KFLOAT32 totalTimeSinceReset)

{
  float fVar1;
  double dVar2;
  undefined8 uVar3;
  KUINT16 i;
  long lVar4;
  double *pdVar5;
  double *pdVar6;
  undefined8 *puVar7;
  KUINT16 i_1;
  long lVar8;
  float (*pafVar9) [3];
  KUINT16 j;
  long lVar10;
  long lVar11;
  undefined1 auVar12 [16];
  bool bVar14;
  undefined4 uVar15;
  TMATRIX I;
  Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> m;
  double local_68;
  undefined8 local_5c;
  undefined8 uStack_54;
  undefined8 local_4c;
  undefined8 uStack_44;
  float local_3c;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  float local_18;
  long lVar13;
  
  pdVar5 = &local_68;
  pdVar6 = &local_68;
  lVar4 = (long)&local_5c + 4;
  lVar8 = 0;
  lVar10 = 0;
  do {
    lVar11 = 0;
    auVar12 = _DAT_001bdf90;
    do {
      bVar14 = SUB164(auVar12 ^ _DAT_001bdf80,4) == -0x80000000 &&
               SUB164(auVar12 ^ _DAT_001bdf80,0) < -0x7ffffffd;
      if (bVar14) {
        uVar15 = 0x3f800000;
        if (lVar8 != lVar11) {
          uVar15 = 0;
        }
        *(undefined4 *)(lVar4 + -4 + lVar11) = uVar15;
      }
      if (bVar14) {
        uVar15 = 0x3f800000;
        if (lVar8 + -4 != lVar11) {
          uVar15 = 0;
        }
        *(undefined4 *)(lVar4 + lVar11) = uVar15;
      }
      lVar13 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 2;
      auVar12._8_8_ = lVar13 + 2;
      lVar11 = lVar11 + 8;
    } while (lVar11 != 0x10);
    lVar10 = lVar10 + 1;
    lVar8 = lVar8 + 4;
    lVar4 = lVar4 + 0xc;
  } while (lVar10 != 3);
  local_68 = (double)((float)totalTimeSinceReset * (float)this->m_f64Magnitude);
  if (local_68 <= 1e-05) {
    res->Data[2][2] = local_3c;
    *(undefined8 *)(res->Data[1] + 1) = local_4c;
    *(undefined8 *)res->Data[2] = uStack_44;
    *(undefined8 *)res->Data[0] = local_5c;
    *(undefined8 *)(res->Data[0] + 2) = uStack_54;
  }
  else {
    dVar2 = cos(local_68);
    fVar1 = (float)this->m_f64Magnitude;
    uVar3 = *(undefined8 *)((this->m_wwMatrix).Data[0] + 2);
    *(undefined8 *)res->Data[0] = *(undefined8 *)(this->m_wwMatrix).Data[0];
    *(undefined8 *)(res->Data[0] + 2) = uVar3;
    uVar3 = *(undefined8 *)(this->m_wwMatrix).Data[2];
    *(undefined8 *)(res->Data[1] + 1) = *(undefined8 *)((this->m_wwMatrix).Data[1] + 1);
    *(undefined8 *)res->Data[2] = uVar3;
    res->Data[2][2] = (this->m_wwMatrix).Data[2][2];
    lVar4 = 0;
    pafVar9 = (float (*) [3])res;
    do {
      lVar8 = 0;
      do {
        (*(float (*) [3])*pafVar9)[lVar8] =
             (*(float (*) [3])*pafVar9)[lVar8] * ((1.0 - (float)dVar2) / (fVar1 * fVar1));
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      lVar4 = lVar4 + 1;
      pafVar9 = pafVar9 + 1;
    } while (lVar4 != 3);
    lVar4 = 0;
    do {
      pdVar5 = (double *)((long)pdVar5 + 0xc);
      lVar8 = 0;
      do {
        *(float *)((long)pdVar5 + lVar8 * 4) = *(float *)((long)pdVar5 + lVar8 * 4) * (float)dVar2;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    dVar2 = sin(local_68);
    fVar1 = (float)this->m_f64Magnitude;
    lVar4 = 0;
    pafVar9 = (float (*) [3])res;
    do {
      pdVar6 = (double *)((long)pdVar6 + 0xc);
      lVar8 = 0;
      do {
        (*(float (*) [3])*pafVar9)[lVar8] =
             *(float *)((long)pdVar6 + lVar8 * 4) + (*(float (*) [3])*pafVar9)[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      lVar4 = lVar4 + 1;
      pafVar9 = pafVar9 + 1;
    } while (lVar4 != 3);
    puVar7 = &local_38;
    local_18 = (this->m_SkewOmegaMatrix).Data[2][2];
    local_28 = *(undefined8 *)((this->m_SkewOmegaMatrix).Data[1] + 1);
    uStack_20 = *(undefined8 *)(this->m_SkewOmegaMatrix).Data[2];
    local_38 = *(undefined8 *)(this->m_SkewOmegaMatrix).Data[0];
    uStack_30 = *(undefined8 *)((this->m_SkewOmegaMatrix).Data[0] + 2);
    lVar4 = 0;
    do {
      lVar8 = 0;
      do {
        *(float *)((long)puVar7 + lVar8 * 4) =
             (float)((double)*(float *)((long)puVar7 + lVar8 * 4) * (dVar2 / (double)fVar1));
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      lVar4 = lVar4 + 1;
      puVar7 = (undefined8 *)((long)puVar7 + 0xc);
    } while (lVar4 != 3);
    puVar7 = &local_38;
    lVar4 = 0;
    do {
      lVar8 = 0;
      do {
        (*(float (*) [3])*(float (*) [3])res)[lVar8] =
             (*(float (*) [3])*(float (*) [3])res)[lVar8] - *(float *)((long)puVar7 + lVar8 * 4);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      lVar4 = lVar4 + 1;
      res = (TMATRIX *)((long)res + 0xc);
      puVar7 = (undefined8 *)((long)puVar7 + 0xc);
    } while (lVar4 != 3);
  }
  return;
}

Assistant:

void DeadReckoningCalculator::computeDRMatrix( TMATRIX& res, const KFLOAT32 totalTimeSinceReset )
{
    TMATRIX I;
    const KFLOAT64 f64DeltaMag = totalTimeSinceReset * m_f64Magnitude;
    if( f64DeltaMag > MAGIC_EPSILON )
    {
        const KFLOAT32 f64CosMagDelta = cos( f64DeltaMag );
        const KFLOAT64 fwwScalar = ( 1 - f64CosMagDelta ) / ( m_f64Magnitude * m_f64Magnitude );
        res = m_wwMatrix;
        res *= fwwScalar;
        I *= f64CosMagDelta;
        const KFLOAT64 f64SkewScalar = sin( f64DeltaMag ) / m_f64Magnitude;
        res += I;
        res -= ( m_SkewOmegaMatrix * f64SkewScalar );
    }
    else
    {
        res = I; // Identity matrix
    }
}